

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalTestNamer::getTestSourceDirectory_abi_cxx11_(ApprovalTestNamer *this)

{
  string *psVar1;
  TestName *in_RDI;
  string file;
  TestName *this_00;
  string local_30 [40];
  TestName *filePath;
  
  this_00 = in_RDI;
  filePath = in_RDI;
  getCurrentTest();
  psVar1 = TestName::getFileName_abi_cxx11_(this_00);
  ::std::__cxx11::string::string(local_30,(string *)psVar1);
  FileUtils::getDirectory((string *)filePath);
  ::std::__cxx11::string::~string(local_30);
  return (string *)in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getTestSourceDirectory() const
    {
        auto file = getCurrentTest().getFileName();
        return FileUtils::getDirectory(file);
    }